

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapTypes.cpp
# Opt level: O2

void TTD::NSSnapType::EmitSnapHandler
               (SnapHandler *snapHandler,FileWriter *writer,Separator separator)

{
  undefined7 in_register_00000011;
  uint32 i;
  ulong uVar1;
  
  (*writer->_vptr_FileWriter[6])(writer,CONCAT71(in_register_00000011,separator) & 0xffffffff);
  FileWriter::WriteAddr(writer,handlerId,snapHandler->HandlerId,NoSeparator);
  FileWriter::WriteUInt32(writer,extensibleFlag,(uint)snapHandler->IsExtensibleFlag,CommaSeparator);
  FileWriter::WriteUInt32(writer,inlineSlotCapacity,snapHandler->InlineSlotCapacity,CommaSeparator);
  FileWriter::WriteUInt32(writer,totalSlotCapacity,snapHandler->TotalSlotCapacity,CommaSeparator);
  FileWriter::WriteLengthValue(writer,snapHandler->MaxPropertyIndex,CommaSeparator);
  if (snapHandler->MaxPropertyIndex != 0) {
    FileWriter::WriteSequenceStart_DefaultKey(writer,CommaSeparator);
    (*writer->_vptr_FileWriter[8])(writer,1);
    for (uVar1 = 0; uVar1 < snapHandler->MaxPropertyIndex; uVar1 = uVar1 + 1) {
      (*writer->_vptr_FileWriter[6])(writer,(ulong)(3 - (uVar1 == 0)));
      FileWriter::WriteUInt32
                (writer,propertyId,snapHandler->PropertyInfoArray[uVar1].PropertyRecordId,
                 NoSeparator);
      FileWriter::WriteTag<TTD::NSSnapType::SnapEntryDataKindTag>
                (writer,dataKindTag,snapHandler->PropertyInfoArray[uVar1].DataKind,CommaSeparator);
      FileWriter::WriteTag<TTD::NSSnapType::SnapAttributeTag>
                (writer,attributeTag,snapHandler->PropertyInfoArray[uVar1].AttributeInfo,
                 CommaSeparator);
      (*writer->_vptr_FileWriter[7])(writer,0);
    }
    (*writer->_vptr_FileWriter[8])(writer,0xffffffffffffffff);
    (*writer->_vptr_FileWriter[5])(writer,2);
  }
  (*writer->_vptr_FileWriter[7])(writer,0);
  return;
}

Assistant:

void EmitSnapHandler(const SnapHandler* snapHandler, FileWriter* writer, NSTokens::Separator separator)
        {
            writer->WriteRecordStart(separator);

            writer->WriteAddr(NSTokens::Key::handlerId, snapHandler->HandlerId);

            writer->WriteUInt32(NSTokens::Key::extensibleFlag, snapHandler->IsExtensibleFlag, NSTokens::Separator::CommaSeparator);

            writer->WriteUInt32(NSTokens::Key::inlineSlotCapacity, snapHandler->InlineSlotCapacity, NSTokens::Separator::CommaSeparator);
            writer->WriteUInt32(NSTokens::Key::totalSlotCapacity, snapHandler->TotalSlotCapacity, NSTokens::Separator::CommaSeparator);

            writer->WriteLengthValue(snapHandler->MaxPropertyIndex, NSTokens::Separator::CommaSeparator);

            if(snapHandler->MaxPropertyIndex > 0)
            {
                writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaSeparator);
                writer->AdjustIndent(1);
                for(uint32 i = 0; i < snapHandler->MaxPropertyIndex; ++i)
                {
                    writer->WriteRecordStart(i != 0 ? NSTokens::Separator::CommaAndBigSpaceSeparator : NSTokens::Separator::BigSpaceSeparator);
                    writer->WriteUInt32(NSTokens::Key::propertyId, snapHandler->PropertyInfoArray[i].PropertyRecordId);
                    writer->WriteTag<SnapEntryDataKindTag>(NSTokens::Key::dataKindTag, snapHandler->PropertyInfoArray[i].DataKind, NSTokens::Separator::CommaSeparator);
                    writer->WriteTag<SnapAttributeTag>(NSTokens::Key::attributeTag, snapHandler->PropertyInfoArray[i].AttributeInfo, NSTokens::Separator::CommaSeparator);
                    writer->WriteRecordEnd();
                }
                writer->AdjustIndent(-1);
                writer->WriteSequenceEnd(NSTokens::Separator::BigSpaceSeparator);
            }

            writer->WriteRecordEnd();
        }